

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prolog.cpp
# Opt level: O3

bool __thiscall Variable::unify(Variable *this,Term *t)

{
  Variable *pVVar1;
  int iVar2;
  Trace *pTVar3;
  
  pVVar1 = (Variable *)this->instance;
  if (pVVar1 != this) {
    iVar2 = (*(pVVar1->super_Term)._vptr_Term[1])(pVVar1,t);
    return SUB41(iVar2,0);
  }
  pTVar3 = (Trace *)operator_new(0x10);
  pTVar3->head = this;
  pTVar3->tail = Trace::history;
  Trace::history = pTVar3;
  this->instance = t;
  return true;
}

Assistant:

bool Variable::unify(Term *t)
{
    if (instance == this) {
        // The variable is uninstantiated.
        // Bind it to this term.
        Trace::Push(this);
        instance = t;
        return true;
    }

    // This variable is already instantiated.
    // Redirect the request to the instance.
    return instance->unify(t);
}